

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool saveKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *keyPresses)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RSI;
  string *in_RDI;
  int i;
  int n;
  ofstream fout;
  int local_228;
  int local_214;
  char local_210 [512];
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_10;
  
  local_10 = in_RSI;
  std::ofstream::ofstream(local_210,in_RDI,_S_bin);
  sVar1 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size
                    (local_10);
  local_214 = (int)sVar1;
  std::ostream::write(local_210,(long)&local_214);
  for (local_228 = 0; local_228 < local_214; local_228 = local_228 + 1) {
    pvVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                       (local_10,(long)local_228);
    std::ostream::write(local_210,(long)&pvVar2->pos);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return true;
}

Assistant:

bool saveKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & keyPresses) {
    std::ofstream fout(fname, std::ios::binary);
    int n = keyPresses.size();
    fout.write((char *)(&n), sizeof(n));
    for (int i = 0; i < n; ++i) {
        fout.write((char *)(&keyPresses[i].pos), sizeof(keyPresses[i].pos));
    }
    fout.close();

    return true;
}